

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndType
          (UCharsTrieBuilder *this,UBool hasValue,int32_t value,int32_t node)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  undefined4 in_register_0000000c;
  ushort uVar4;
  UChar intUnits [3];
  undefined8 uStack_8;
  
  if (hasValue != '\0') {
    uStack_8._0_4_ = (undefined4)in_RAX;
    if ((uint)value < 0xfe0000) {
      if ((uint)value < 0x100) {
        uVar4 = (short)value * 0x40 + 0x40;
        uVar2 = 1;
        uStack_8 = in_RAX;
      }
      else {
        uStack_8._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
        uStack_8._0_6_ = CONCAT24((short)value,(undefined4)uStack_8);
        uVar4 = ((ushort)((uint)value >> 10) & 0x3fc0) + 0x4040;
        uVar2 = 2;
      }
    }
    else {
      uStack_8 = CONCAT44((uint)value >> 0x10 | value << 0x10,(undefined4)uStack_8);
      uVar2 = 3;
      uVar4 = 0x7fc0;
    }
    uStack_8._0_4_ = CONCAT22(uVar4 | (ushort)node,(undefined2)uStack_8);
    sVar3 = write(this,(int)&uStack_8 + 2,(void *)(ulong)uVar2,CONCAT44(in_register_0000000c,node));
    return (int32_t)sVar3;
  }
  iVar1 = (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])(this,node);
  return iVar1;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndType(UBool hasValue, int32_t value, int32_t node) {
    if(!hasValue) {
        return write(node);
    }
    UChar intUnits[3];
    int32_t length;
    if(value<0 || value>UCharsTrie::kMaxTwoUnitNodeValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitNodeValueLead);
        intUnits[1]=(UChar)((uint32_t)value>>16);
        intUnits[2]=(UChar)value;
        length=3;
    } else if(value<=UCharsTrie::kMaxOneUnitNodeValue) {
        intUnits[0]=(UChar)((value+1)<<6);
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitNodeValueLead+((value>>10)&0x7fc0));
        intUnits[1]=(UChar)value;
        length=2;
    }
    intUnits[0]|=(UChar)node;
    return write(intUnits, length);
}